

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::MatchLiteralNode::TransferPass1
          (MatchLiteralNode *this,Compiler *compiler,Char *litbuf)

{
  uint uVar1;
  CharCount CVar2;
  Program *pPVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  uint uVar8;
  CharCount i;
  ulong uVar9;
  
  pPVar3 = compiler->program;
  uVar1 = (pPVar3->rep).insts.litbufLen;
  if (this->isEquivClass == false) {
    CVar2 = this->offset;
    uVar8 = this->length;
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      (pPVar3->rep).insts.litbuf.ptr[uVar1 + (int)uVar9] = litbuf[CVar2 + (int)uVar9];
    }
  }
  else {
    if ((pPVar3->flags & IgnoreCaseRegexFlag) == NoRegexFlags) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x345,"((compiler.program->flags & IgnoreCaseRegexFlag) != 0)",
                         "(compiler.program->flags & IgnoreCaseRegexFlag) != 0");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    uVar8 = 0;
    uVar9 = 0;
    while( true ) {
      pPVar3 = compiler->program;
      if (this->length <= uVar9) break;
      StandardChars<char16_t>::ToEquivs
                (compiler->standardChars,pPVar3->flags >> 3 & CaseFolding,
                 litbuf[this->offset + (int)uVar9],
                 (pPVar3->rep).insts.litbuf.ptr + (ulong)uVar1 + (ulong)uVar8);
      uVar9 = uVar9 + 1;
      uVar8 = uVar8 + 4;
    }
    uVar8 = this->length << 2;
  }
  pTVar7 = &(pPVar3->rep).insts.litbufLen;
  *pTVar7 = *pTVar7 + uVar8;
  this->offset = uVar1;
  return;
}

Assistant:

void MatchLiteralNode::TransferPass1(Compiler& compiler, const Char* litbuf)
    {
        CharCount nextLit = compiler.program->rep.insts.litbufLen;
        if (isEquivClass)
        {
            Assert((compiler.program->flags & IgnoreCaseRegexFlag) != 0);
            // Expand literal according to character equivalence classes
            for (CharCount i = 0; i < length; i++)
            {
                compiler.standardChars->ToEquivs(
                    compiler.program->GetCaseMappingSource(),
                    litbuf[offset + i],
                    compiler.program->rep.insts.litbuf + nextLit + i * CaseInsensitive::EquivClassSize);
            }
            compiler.program->rep.insts.litbufLen += length * CaseInsensitive::EquivClassSize;
        }
        else
        {
            for (CharCount i = 0; i < length; i++)
                compiler.program->rep.insts.litbuf[nextLit + i] = litbuf[offset + i];
            compiler.program->rep.insts.litbufLen += length;
        }
        offset = nextLit;
    }